

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReadVarint(PmaReader *p,u64 *pnOut)

{
  byte bVar1;
  int iVar2;
  u64 *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int rc;
  int i;
  int iBuf;
  u8 *a;
  u8 aVarint [16];
  uint local_40;
  int local_24;
  undefined1 *local_18;
  undefined1 *local_10;
  u8 **ppOut;
  
  ppOut = *(u8 ***)(in_FS_OFFSET + 0x28);
  if (in_RDI[8] == 0) {
    iVar2 = (int)(*in_RDI % (long)(int)in_RDI[7]);
    if ((iVar2 == 0) || ((int)in_RDI[7] - iVar2 < 9)) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = 0;
      do {
        local_24 = vdbePmaReadBlob(_i,rc,ppOut);
        if (local_24 != 0) goto LAB_0019b2cc;
        *(byte *)((long)&local_18 + (long)(int)(local_40 & 0xf)) = DAT_aaaaaaaaaaaaaaaa;
        local_40 = local_40 + 1;
      } while ((DAT_aaaaaaaaaaaaaaaa & 0x80) != 0);
      sqlite3GetVarint((uchar *)&local_18,in_RSI);
    }
    else {
      bVar1 = sqlite3GetVarint((uchar *)(in_RDI[6] + (long)iVar2),in_RSI);
      *in_RDI = (ulong)bVar1 + *in_RDI;
    }
  }
  else {
    bVar1 = sqlite3GetVarint((uchar *)(in_RDI[8] + *in_RDI),in_RSI);
    *in_RDI = (ulong)bVar1 + *in_RDI;
  }
  local_24 = 0;
LAB_0019b2cc:
  if (*(u8 ***)(in_FS_OFFSET + 0x28) != ppOut) {
    __stack_chk_fail();
  }
  return local_24;
}

Assistant:

static int vdbePmaReadVarint(PmaReader *p, u64 *pnOut){
  int iBuf;

  if( p->aMap ){
    p->iReadOff += sqlite3GetVarint(&p->aMap[p->iReadOff], pnOut);
  }else{
    iBuf = p->iReadOff % p->nBuffer;
    if( iBuf && (p->nBuffer-iBuf)>=9 ){
      p->iReadOff += sqlite3GetVarint(&p->aBuffer[iBuf], pnOut);
    }else{
      u8 aVarint[16], *a;
      int i = 0, rc;
      do{
        rc = vdbePmaReadBlob(p, 1, &a);
        if( rc ) return rc;
        aVarint[(i++)&0xf] = a[0];
      }while( (a[0]&0x80)!=0 );
      sqlite3GetVarint(aVarint, pnOut);
    }
  }

  return SQLITE_OK;
}